

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

int secp256k1_musig_pubkey_agg
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *agg_pk,
              secp256k1_musig_keyagg_cache *keyagg_cache,secp256k1_pubkey **pubkeys,size_t n_pubkeys
              )

{
  int iVar1;
  undefined8 *in_RCX;
  long in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  secp256k1_keyagg_cache_internal *in_R8;
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge pk;
  size_t i;
  secp256k1_ge pkp;
  secp256k1_gej pkj;
  secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
  secp256k1_pubkey *in_stack_fffffffffffffd08;
  secp256k1_keyagg_cache_internal *ge;
  secp256k1_ge *in_stack_fffffffffffffd10;
  secp256k1_context *in_stack_fffffffffffffd18;
  secp256k1_gej *in_stack_fffffffffffffd58;
  secp256k1_ge *in_stack_fffffffffffffd60;
  undefined1 auStack_290 [64];
  size_t in_stack_fffffffffffffdb0;
  secp256k1_pubkey **in_stack_fffffffffffffdb8;
  uchar *in_stack_fffffffffffffdc0;
  secp256k1_context *in_stack_fffffffffffffdc8;
  void *in_stack_fffffffffffffdf0;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffdf8;
  secp256k1_scalar *in_stack_fffffffffffffe00;
  secp256k1_gej *in_stack_fffffffffffffe08;
  secp256k1_scratch *in_stack_fffffffffffffe10;
  secp256k1_callback *in_stack_fffffffffffffe18;
  size_t in_stack_fffffffffffffe30;
  secp256k1_keyagg_cache_internal *local_198;
  undefined1 local_190 [40];
  secp256k1_fe asStack_168 [4];
  undefined8 local_b8;
  undefined8 *local_90;
  undefined1 auStack_88 [88];
  secp256k1_keyagg_cache_internal *local_30;
  undefined8 *local_28;
  long local_20;
  void *local_18;
  undefined8 local_10;
  int local_4;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RSI != (void *)0x0) {
    memset(in_RSI,0,0x40);
  }
  if (local_28 == (undefined8 *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    local_4 = 0;
  }
  else if (local_30 == (secp256k1_keyagg_cache_internal *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    local_4 = 0;
  }
  else {
    local_b8 = local_10;
    local_90 = local_28;
    secp256k1_ge_set_infinity((secp256k1_ge *)0x1089d3);
    for (local_198 = (secp256k1_keyagg_cache_internal *)0x1; local_198 < local_30;
        local_198 = (secp256k1_keyagg_cache_internal *)((long)(local_198->pk).x.n + 1)) {
      iVar1 = secp256k1_memcmp_var((void *)*local_28,(void *)local_28[(long)local_198],0x40);
      if (iVar1 != 0) {
        iVar1 = secp256k1_pubkey_load
                          (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                           in_stack_fffffffffffffd08);
        if (iVar1 == 0) {
          return 0;
        }
        memcpy(auStack_88,&stack0xfffffffffffffe10,0x58);
        break;
      }
    }
    iVar1 = secp256k1_musig_compute_pks_hash
                      (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8
                       ,in_stack_fffffffffffffdb0);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_ecmult_multi_var
                        (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffe30);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_ge_set_gej(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        secp256k1_fe_impl_normalize_var(asStack_168);
        ge = local_30;
        if (local_20 != 0) {
          memset(&stack0xfffffffffffffd18,0,0xf8);
          memcpy(&stack0xfffffffffffffd18,local_190,0x58);
          memcpy(auStack_290,auStack_88,0x58);
          secp256k1_keyagg_cache_save
                    ((secp256k1_musig_keyagg_cache *)in_stack_fffffffffffffd10,local_30);
          ge = local_30;
        }
        if (local_18 != (void *)0x0) {
          secp256k1_extrakeys_ge_even_y(in_stack_fffffffffffffd10);
          secp256k1_xonly_pubkey_save((secp256k1_xonly_pubkey *)in_stack_fffffffffffffd10,&ge->pk);
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_pubkey_agg(const secp256k1_context* ctx, secp256k1_xonly_pubkey *agg_pk, secp256k1_musig_keyagg_cache *keyagg_cache, const secp256k1_pubkey * const* pubkeys, size_t n_pubkeys) {
    secp256k1_musig_pubkey_agg_ecmult_data ecmult_data;
    secp256k1_gej pkj;
    secp256k1_ge pkp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    if (agg_pk != NULL) {
        memset(agg_pk, 0, sizeof(*agg_pk));
    }
    ARG_CHECK(pubkeys != NULL);
    ARG_CHECK(n_pubkeys > 0);

    ecmult_data.ctx = ctx;
    ecmult_data.pks = pubkeys;

    secp256k1_ge_set_infinity(&ecmult_data.second_pk);
    for (i = 1; i < n_pubkeys; i++) {
        if (secp256k1_memcmp_var(pubkeys[0], pubkeys[i], sizeof(*pubkeys[0])) != 0) {
            secp256k1_ge pk;
            if (!secp256k1_pubkey_load(ctx, &pk, pubkeys[i])) {
                return 0;
            }
            ecmult_data.second_pk = pk;
            break;
        }
    }

    if (!secp256k1_musig_compute_pks_hash(ctx, ecmult_data.pks_hash, pubkeys, n_pubkeys)) {
        return 0;
    }
    /* TODO: actually use optimized ecmult_multi algorithms by providing a
     * scratch space */
    if (!secp256k1_ecmult_multi_var(&ctx->error_callback, NULL, &pkj, NULL, secp256k1_musig_pubkey_agg_callback, (void *) &ecmult_data, n_pubkeys)) {
        /* In order to reach this line with the current implementation of
         * ecmult_multi_var one would need to provide a callback that can
         * fail. */
        return 0;
    }
    secp256k1_ge_set_gej(&pkp, &pkj);
    secp256k1_fe_normalize_var(&pkp.y);
    /* The resulting public key is infinity with negligible probability */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&pkp));
    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i = { 0 };
        cache_i.pk = pkp;
        cache_i.second_pk = ecmult_data.second_pk;
        memcpy(cache_i.pks_hash, ecmult_data.pks_hash, sizeof(cache_i.pks_hash));
        secp256k1_keyagg_cache_save(keyagg_cache, &cache_i);
    }

    if (agg_pk != NULL) {
        secp256k1_extrakeys_ge_even_y(&pkp);
        secp256k1_xonly_pubkey_save(agg_pk, &pkp);
    }
    return 1;
}